

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

bool __thiscall llvm::FoldingSetNodeID::operator==(FoldingSetNodeID *this,FoldingSetNodeIDRef RHS)

{
  bool bVar1;
  FoldingSetNodeIDRef local_10;
  
  local_10.Data =
       (uint *)(this->Bits).super_SmallVectorImpl<unsigned_int>.
               super_SmallVectorTemplateBase<unsigned_int,_true>.
               super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  local_10.Size =
       (size_t)(this->Bits).super_SmallVectorImpl<unsigned_int>.
               super_SmallVectorTemplateBase<unsigned_int,_true>.
               super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  bVar1 = FoldingSetNodeIDRef::operator==(&local_10,RHS);
  return bVar1;
}

Assistant:

bool FoldingSetNodeID::operator==(FoldingSetNodeIDRef RHS) const {
  return FoldingSetNodeIDRef(Bits.data(), Bits.size()) == RHS;
}